

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Expression * __thiscall hdc::Parser::parse_array_expression(Parser *this)

{
  bool bVar1;
  ArrayExpression *this_00;
  Expression *expression;
  
  this_00 = (ArrayExpression *)operator_new(0x40);
  ArrayExpression::ArrayExpression(this_00);
  expect(this,TK_LEFT_CURLY_BRACKET);
  bVar1 = lookahead(this,TK_RIGHT_CURLY_BRACKET);
  if (!bVar1) {
    do {
      expression = parse_assignment_expression(this);
      ArrayExpression::addExpression(this_00,expression);
      bVar1 = match(this,TK_COMMA);
    } while (bVar1);
  }
  expect(this,TK_RIGHT_CURLY_BRACKET);
  return &this_00->super_Expression;
}

Assistant:

Expression* Parser::parse_array_expression() {
    ArrayExpression* array;

    array = new ArrayExpression();

    expect(TK_LEFT_CURLY_BRACKET);

    if (!lookahead(TK_RIGHT_CURLY_BRACKET)) {
        array->addExpression(parse_expression());

        while (match(TK_COMMA)) {
            array->addExpression(parse_expression());
        }
    }

    expect(TK_RIGHT_CURLY_BRACKET);
    return array;
}